

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  WeaponReceiver *weapon;
  Commander *this;
  Commander *commander;
  Tank *tank;
  char **argv_local;
  int argc_local;
  
  weapon = (WeaponReceiver *)operator_new(8);
  Tank::Tank((Tank *)weapon);
  this = (Commander *)operator_new(0x10);
  Commander::Commander(this,weapon);
  Commander::order(this,ORDER_FIRE);
  Commander::order(this,ORDER_MOVE);
  Commander::order(this,ORDER_RELOAD);
  if (this != (Commander *)0x0) {
    (*this->_vptr_Commander[1])();
  }
  if (weapon != (WeaponReceiver *)0x0) {
    (*weapon->_vptr_WeaponReceiver[4])();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	Tank *tank = new Tank();
	Commander *commander = new Commander(tank);

	commander->order(Commander::ORDER_FIRE);
	commander->order(Commander::ORDER_MOVE);
	commander->order(Commander::ORDER_RELOAD);

	delete commander;
	delete tank;

	return 0;
}